

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctaes.c
# Opt level: O0

void MultX(AES_state *s)

{
  ushort uVar1;
  long lVar2;
  ushort *in_RDI;
  long in_FS_OFFSET;
  uint16_t top;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = in_RDI[7];
  in_RDI[7] = in_RDI[6];
  in_RDI[6] = in_RDI[5];
  in_RDI[5] = in_RDI[4];
  in_RDI[4] = in_RDI[3] ^ uVar1;
  in_RDI[3] = in_RDI[2] ^ uVar1;
  in_RDI[2] = in_RDI[1];
  in_RDI[1] = *in_RDI ^ uVar1;
  *in_RDI = uVar1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void MultX(AES_state* s) {
    uint16_t top = s->slice[7];
    s->slice[7] = s->slice[6];
    s->slice[6] = s->slice[5];
    s->slice[5] = s->slice[4];
    s->slice[4] = s->slice[3] ^ top;
    s->slice[3] = s->slice[2] ^ top;
    s->slice[2] = s->slice[1];
    s->slice[1] = s->slice[0] ^ top;
    s->slice[0] = top;
}